

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderTestInstance::draw
          (VertexShaderTestInstance *this,VkCommandBuffer cmdBuffer)

{
  VkPrimitiveTopology VVar1;
  DeviceInterface *pDVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uStack_30;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  VVar1 = ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology;
  if (VVar1 < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST) {
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1,0,0);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1,4,1);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1,8,2);
      UNRECOVERED_JUMPTABLE = pDVar2->_vptr_DeviceInterface[0x59];
      uStack_30 = 0xc;
      uVar4 = uStack_30;
      uStack_30 = 3;
      uVar3 = 4;
    }
    else {
      UNRECOVERED_JUMPTABLE = pDVar2->_vptr_DeviceInterface[0x59];
      uVar3 = 0x10;
      uVar4 = 0;
      uStack_30 = 0;
    }
    (*UNRECOVERED_JUMPTABLE)(pDVar2,cmdBuffer,uVar3,1,uVar4,uStack_30);
    return;
  }
  return;
}

Assistant:

void VertexShaderTestInstance::draw (VkCommandBuffer cmdBuffer)
{
	const DeviceInterface& vk = m_context.getDeviceInterface();
	switch(m_parametersGraphic.primitiveTopology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vk.cmdDraw(cmdBuffer, 16u, 1u, 0u, 0u);
			break;
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			vk.cmdDraw(cmdBuffer, 4u, 1u, 0u,  0u);
			vk.cmdDraw(cmdBuffer, 4u, 1u, 4u,  1u);
			vk.cmdDraw(cmdBuffer, 4u, 1u, 8u,  2u);
			vk.cmdDraw(cmdBuffer, 4u, 1u, 12u, 3u);
			break;
		default:
			DE_ASSERT(0);
			break;
	}
}